

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O0

int Nf_ManPrepareCuts(Nf_Cut_t *pCuts,Nf_Man_t *p,int iObj,int fAddUnit)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  word wVar5;
  int *pList;
  int *pCut;
  Nf_Cut_t *pNStack_30;
  int i;
  Nf_Cut_t *pMfCut;
  int fAddUnit_local;
  int iObj_local;
  Nf_Man_t *p_local;
  Nf_Cut_t *pCuts_local;
  
  iVar1 = Nf_ObjHasCuts(p,iObj);
  if (iVar1 == 0) {
    pCuts_local._4_4_ = Nf_CutCreateUnit(pCuts,iObj);
  }
  else {
    piVar4 = Nf_ObjCutSet(p,iObj);
    pCut._4_4_ = 0;
    pList = piVar4 + 1;
    pNStack_30 = pCuts;
    while (pCut._4_4_ < *piVar4) {
      pNStack_30->Delay = 0;
      pNStack_30->Flow = 0.0;
      uVar2 = Nf_CutFunc(pList);
      *(uint *)&pNStack_30->field_0x10 =
           *(uint *)&pNStack_30->field_0x10 & 0xfc000000 | uVar2 & 0x3ffffff;
      iVar1 = Nf_CutSize(pList);
      *(uint *)&pNStack_30->field_0x10 =
           *(uint *)&pNStack_30->field_0x10 & 0x7ffffff | iVar1 << 0x1b;
      iVar1 = Nf_CutSize(pList);
      wVar5 = Nf_CutGetSign(pList + 1,iVar1);
      pNStack_30->Sign = wVar5;
      iVar1 = Abc_Lit2Var(*(uint *)&pNStack_30->field_0x10 & 0x3ffffff);
      uVar2 = Nf_ObjCutUseless(p,iVar1);
      *(uint *)&pNStack_30->field_0x10 =
           *(uint *)&pNStack_30->field_0x10 & 0xfbffffff | (uVar2 & 1) << 0x1a;
      iVar1 = Nf_CutSize(pList);
      memcpy(pNStack_30->pLeaves,pList + 1,(long)iVar1 << 2);
      pNStack_30 = pNStack_30 + 1;
      pCut._4_4_ = pCut._4_4_ + 1;
      iVar1 = Nf_CutSize(pList);
      pList = pList + (iVar1 + 1);
    }
    if ((fAddUnit == 0) || (*(uint *)&pCuts->field_0x10 >> 0x1b < 2)) {
      pCuts_local._4_4_ = *piVar4;
    }
    else {
      iVar1 = *piVar4;
      iVar3 = Nf_CutCreateUnit(pNStack_30,iObj);
      pCuts_local._4_4_ = iVar1 + iVar3;
    }
  }
  return pCuts_local._4_4_;
}

Assistant:

static inline int Nf_ManPrepareCuts( Nf_Cut_t * pCuts, Nf_Man_t * p, int iObj, int fAddUnit )
{
    if ( Nf_ObjHasCuts(p, iObj) )
    {
        Nf_Cut_t * pMfCut = pCuts;
        int i, * pCut, * pList = Nf_ObjCutSet(p, iObj);
        Nf_SetForEachCut( pList, pCut, i )
        {
            pMfCut->Delay   = 0;
            pMfCut->Flow    = 0;
            pMfCut->iFunc   = Nf_CutFunc( pCut );
            pMfCut->nLeaves = Nf_CutSize( pCut );
            pMfCut->Sign    = Nf_CutGetSign( pCut+1, Nf_CutSize(pCut) );
            pMfCut->Useless = Nf_ObjCutUseless( p, Abc_Lit2Var(pMfCut->iFunc) );
            memcpy( pMfCut->pLeaves, pCut+1, sizeof(int) * Nf_CutSize(pCut) );
            pMfCut++;
        }
        if ( fAddUnit && pCuts->nLeaves > 1 )
            return pList[0] + Nf_CutCreateUnit( pMfCut, iObj );
        return pList[0];
    }
    return Nf_CutCreateUnit( pCuts, iObj );
}